

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ag::BitConverter::Get
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          agvariant *v)

{
  uchar *puVar1;
  variant_alternative_t<4UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar2;
  variant_alternative_t<2UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar3;
  variant_alternative_t<3UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar4;
  variant_alternative_t<1UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar5;
  initializer_list<unsigned_char> __l;
  allocator_type local_32;
  uchar local_31;
  string local_30;
  
  switch((v->
         super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
         .
         super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
         .super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>.
         super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>.
         super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
         ._M_index) {
  case '\0':
    puVar1 = (uchar *)std::get<0ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    local_31 = *puVar1;
    __l._M_len = 1;
    __l._M_array = &local_31;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,__l,&local_32);
    break;
  case '\x01':
    pvVar5 = std::get<1ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    GetUInt32(__return_storage_ptr__,*pvVar5);
    break;
  case '\x02':
    pvVar3 = std::get<2ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    GetInt32(__return_storage_ptr__,*pvVar3);
    break;
  case '\x03':
    pvVar4 = std::get<3ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    GetFloat(__return_storage_ptr__,*pvVar4);
    break;
  case '\x04':
    pvVar2 = std::get<4ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    std::__cxx11::string::string((string *)&local_30,(string *)pvVar2);
    GetString(__return_storage_ptr__,&local_30,true);
    std::__cxx11::string::~string((string *)&local_30);
    break;
  default:
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint8_t> Get(agvariant v)
		{
			if (std::holds_alternative<int>(v))
				return BitConverter::GetInt32(std::get<int>(v));
			else if (std::holds_alternative<char>(v))
				return { (uint8_t)std::get<char>(v) };
			else if (std::holds_alternative<unsigned int>(v))
				return BitConverter::GetUInt32(std::get<unsigned int>(v));
			else if (std::holds_alternative<float>(v))
				return BitConverter::GetFloat(std::get<float>(v));
			else if (std::holds_alternative<std::string>(v))
				return BitConverter::GetString(std::get<std::string>(v));
			return std::vector<uint8_t>();
		}